

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O2

rnndelem * trydelem(rnndb *db,char *file,xmlNode *node)

{
  unsigned_short *puVar1;
  xmlChar *pxVar2;
  xmlAttr *pxVar3;
  rnndb *prVar4;
  rnnetype rVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  rnndelem *prVar10;
  rnndelem **__ptr;
  rnndelem *prVar11;
  uint64_t uVar12;
  xmlNode *node_00;
  long lVar13;
  xmlNode *node_01;
  _xmlAttr **pp_Var14;
  char *pcVar15;
  _xmlNode **pp_Var16;
  unsigned_short *local_58;
  int *local_48;
  
  pxVar2 = node->name;
  iVar7 = strcmp((char *)pxVar2,"use-group");
  if (iVar7 == 0) {
    prVar11 = (rnndelem *)calloc(0x108,1);
    prVar11->file = file;
    prVar11->type = RNN_ETYPE_USE_GROUP;
    pcVar15 = (char *)0x0;
    pp_Var14 = &node->properties;
    while (pxVar3 = *pp_Var14, pxVar3 != (xmlAttr *)0x0) {
      pxVar2 = pxVar3->name;
      iVar7 = strcmp((char *)pxVar2,"name");
      if (iVar7 == 0) {
        pcVar15 = getattrib(db,file,(uint)node->line,pxVar3);
        pcVar15 = strdup(pcVar15);
        prVar11->name = pcVar15;
      }
      else {
        fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for %s\n",file,(ulong)node->line,pxVar2,
                node->name);
        db->estatus = 1;
      }
      pp_Var14 = &pxVar3->next;
    }
    if (pcVar15 != (char *)0x0) {
      return prVar11;
    }
    pcVar15 = "%s:%d: nameless use-group\n";
LAB_001065ad:
    local_48 = &db->estatus;
    local_58 = &node->line;
    prVar11 = (rnndelem *)0x0;
    fprintf(_stderr,pcVar15,file,(ulong)*local_58);
    *local_48 = 1;
  }
  else {
    iVar7 = strcmp((char *)pxVar2,"stripe");
    if (iVar7 == 0) {
      rVar5 = RNN_ETYPE_STRIPE;
    }
    else {
      iVar8 = strcmp((char *)pxVar2,"array");
      if (iVar8 != 0) {
        iVar7 = strcmp((char *)pxVar2,"reg8");
        if (iVar7 == 0) {
          iVar7 = 8;
        }
        else {
          iVar7 = strcmp((char *)pxVar2,"reg16");
          if (iVar7 == 0) {
            iVar7 = 0x10;
          }
          else {
            iVar7 = strcmp((char *)pxVar2,"reg32");
            if (iVar7 == 0) {
              iVar7 = 0x20;
            }
            else {
              iVar7 = strcmp((char *)pxVar2,"reg64");
              if (iVar7 != 0) {
                return (rnndelem *)0x0;
              }
              iVar7 = 0x40;
            }
          }
        }
        prVar11 = (rnndelem *)calloc(0x108,1);
        prVar11->file = file;
        prVar11->width = iVar7;
        prVar11->length = 1;
        prVar11->access = RNN_ACCESS_RW;
        puVar1 = &node->line;
        pp_Var14 = &node->properties;
        while (pxVar3 = *pp_Var14, pxVar3 != (xmlAttr *)0x0) {
          pxVar2 = pxVar3->name;
          iVar7 = strcmp((char *)pxVar2,"name");
          if (iVar7 == 0) {
            pcVar15 = getattrib(db,file,(uint)*puVar1,pxVar3);
            pcVar15 = strdup(pcVar15);
            prVar11->name = pcVar15;
          }
          else {
            iVar7 = strcmp((char *)pxVar2,"offset");
            if (iVar7 == 0) {
              uVar12 = getnumattrib(db,file,(uint)*puVar1,pxVar3);
              prVar11->offset = uVar12;
            }
            else {
              iVar7 = strcmp((char *)pxVar2,"length");
              if (iVar7 == 0) {
                uVar12 = getnumattrib(db,file,(uint)*puVar1,pxVar3);
                prVar11->length = uVar12;
              }
              else {
                iVar7 = strcmp((char *)pxVar2,"stride");
                if (iVar7 == 0) {
                  uVar12 = getnumattrib(db,file,(uint)*puVar1,pxVar3);
                  prVar11->stride = uVar12;
                }
                else {
                  iVar7 = strcmp((char *)pxVar2,"varset");
                  if (iVar7 == 0) {
                    pcVar15 = getattrib(db,file,(uint)*puVar1,pxVar3);
                    pcVar15 = strdup(pcVar15);
                    (prVar11->varinfo).varsetstr = pcVar15;
                  }
                  else {
                    iVar7 = strcmp((char *)pxVar2,"variants");
                    if (iVar7 == 0) {
                      pcVar15 = getattrib(db,file,(uint)*puVar1,pxVar3);
                      pcVar15 = strdup(pcVar15);
                      (prVar11->varinfo).variantsstr = pcVar15;
                    }
                    else {
                      iVar7 = strcmp((char *)pxVar2,"access");
                      if (iVar7 == 0) {
                        pcVar15 = getattrib(db,file,(uint)*puVar1,pxVar3);
                        if (*pcVar15 == 'w') {
                          if (pcVar15[1] != '\0') goto LAB_001064c7;
                          prVar11->access = RNN_ACCESS_W;
                        }
                        else if (*pcVar15 == 'r') {
                          if (pcVar15[1] == '\0') {
                            prVar11->access = RNN_ACCESS_R;
                          }
                          else {
                            if ((pcVar15[1] != 'w') || (pcVar15[2] != '\0')) goto LAB_001064c7;
                            prVar11->access = RNN_ACCESS_RW;
                          }
                        }
                        else {
LAB_001064c7:
                          fprintf(_stderr,"%s:%d: wrong access type \"%s\" for register\n",file,
                                  (ulong)*puVar1,pcVar15);
                        }
                      }
                      else {
                        iVar7 = trytypeattr(db,file,node,pxVar3,&prVar11->typeinfo);
                        if (iVar7 == 0) {
                          fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for register\n",file,
                                  (ulong)*puVar1,pxVar3->name);
                          db->estatus = 1;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          pp_Var14 = &pxVar3->next;
        }
        pp_Var16 = &node->children;
        while (prVar4 = (rnndb *)*pp_Var16, prVar4 != (rnndb *)0x0) {
          if ((((*(int *)&(prVar4->copyright).license == 1) &&
               (iVar7 = trytypetag(db,file,(xmlNode *)prVar4,&prVar11->typeinfo), iVar7 == 0)) &&
              (pcVar15 = file, iVar7 = trytop(db,file,(xmlNode *)prVar4), iVar7 == 0)) &&
             (iVar7 = trydoc(prVar4,pcVar15,node_01), iVar7 == 0)) {
            fprintf(_stderr,"%s:%d: wrong tag in %s: <%s>\n",file,(ulong)*(ushort *)&prVar4->files,
                    node->name,(prVar4->copyright).authors);
            db->estatus = 1;
          }
          pp_Var16 = (_xmlNode **)&prVar4->bitsets;
        }
        if (prVar11->name != (char *)0x0) {
          return prVar11;
        }
        pcVar15 = "%s:%d: nameless register\n";
        goto LAB_001065ad;
      }
      rVar5 = RNN_ETYPE_ARRAY;
    }
    prVar11 = (rnndelem *)calloc(0x108,1);
    prVar11->type = rVar5;
    prVar11->length = 1;
    prVar11->file = file;
    pp_Var14 = &node->properties;
    while (pxVar3 = *pp_Var14, pxVar3 != (xmlAttr *)0x0) {
      pxVar2 = pxVar3->name;
      iVar8 = strcmp((char *)pxVar2,"name");
      if (iVar8 == 0) {
        pcVar15 = getattrib(db,file,(uint)node->line,pxVar3);
        pcVar15 = strdup(pcVar15);
        prVar11->name = pcVar15;
      }
      else {
        iVar8 = strcmp((char *)pxVar2,"offset");
        if (iVar8 == 0) {
          uVar12 = getnumattrib(db,file,(uint)node->line,pxVar3);
          prVar11->offset = uVar12;
        }
        else {
          iVar8 = strcmp((char *)pxVar2,"length");
          if (iVar8 == 0) {
            uVar12 = getnumattrib(db,file,(uint)node->line,pxVar3);
            prVar11->length = uVar12;
          }
          else {
            iVar8 = strcmp((char *)pxVar2,"stride");
            if (iVar8 == 0) {
              uVar12 = getnumattrib(db,file,(uint)node->line,pxVar3);
              prVar11->stride = uVar12;
            }
            else {
              iVar8 = strcmp((char *)pxVar2,"prefix");
              if (iVar8 == 0) {
                pcVar15 = getattrib(db,file,(uint)node->line,pxVar3);
                pcVar15 = strdup(pcVar15);
                (prVar11->varinfo).prefixstr = pcVar15;
              }
              else {
                iVar8 = strcmp((char *)pxVar2,"varset");
                if (iVar8 == 0) {
                  pcVar15 = getattrib(db,file,(uint)node->line,pxVar3);
                  pcVar15 = strdup(pcVar15);
                  (prVar11->varinfo).varsetstr = pcVar15;
                }
                else {
                  iVar8 = strcmp((char *)pxVar2,"variants");
                  if (iVar8 == 0) {
                    pcVar15 = getattrib(db,file,(uint)node->line,pxVar3);
                    pcVar15 = strdup(pcVar15);
                    (prVar11->varinfo).variantsstr = pcVar15;
                  }
                  else {
                    fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for %s\n",file,(ulong)node->line,
                            pxVar2,node->name);
                    db->estatus = 1;
                  }
                }
              }
            }
          }
        }
      }
      pp_Var14 = &pxVar3->next;
    }
    __ptr = (rnndelem **)0x0;
    iVar6 = 0;
    iVar8 = 0;
    pp_Var16 = &node->children;
    while (prVar4 = (rnndb *)*pp_Var16, prVar4 != (rnndb *)0x0) {
      if (*(int *)&(prVar4->copyright).license == 1) {
        prVar10 = trydelem(db,file,(xmlNode *)prVar4);
        if (prVar10 == (rnndelem *)0x0) {
          pcVar15 = file;
          iVar9 = trytop(db,file,(xmlNode *)prVar4);
          if ((iVar9 == 0) && (iVar9 = trydoc(prVar4,pcVar15,node_00), iVar9 == 0)) {
            fprintf(_stderr,"%s:%d: wrong tag in %s: <%s>\n",file,(ulong)*(ushort *)&prVar4->files,
                    node->name,(prVar4->copyright).authors);
            db->estatus = 1;
          }
        }
        else {
          if (iVar6 <= iVar8) {
            iVar9 = iVar6 * 2;
            if (iVar6 == 0) {
              iVar9 = 0x10;
            }
            prVar11->subelemsmax = iVar9;
            __ptr = (rnndelem **)realloc(__ptr,(long)iVar9 << 3);
            prVar11->subelems = __ptr;
            iVar6 = iVar9;
          }
          lVar13 = (long)iVar8;
          iVar8 = iVar8 + 1;
          prVar11->subelemsnum = iVar8;
          __ptr[lVar13] = prVar10;
        }
      }
      pp_Var16 = (_xmlNode **)&prVar4->bitsets;
    }
    if ((iVar7 != 0) && (prVar11->stride == 0)) {
      fprintf(_stderr,"%s: Array %s\'s stride is undefined. Aborting.\n",file,prVar11->name);
      exit(-1);
    }
  }
  return prVar11;
}

Assistant:

static struct rnndelem *trydelem(struct rnndb *db, char *file, xmlNode *node) {
	if (!strcmp(node->name, "use-group")) {
		struct rnndelem *res = calloc(sizeof *res, 1);
		res->file = file;
		res->type = RNN_ETYPE_USE_GROUP;
		xmlAttr *attr = node->properties;
		while (attr) {
			if (!strcmp(attr->name, "name")) {
				res->name = strdup(getattrib(db, file, node->line, attr));
			} else {
				fprintf (stderr, "%s:%d: wrong attribute \"%s\" for %s\n", file, node->line, attr->name, node->name);
				db->estatus = 1;
			}
			attr = attr->next;
		}
		if (!res->name) {
			fprintf (stderr, "%s:%d: nameless use-group\n", file, node->line);
			db->estatus = 1;
			return 0;
		}
		return res;
	} else if (!strcmp(node->name, "stripe") || !strcmp(node->name, "array")) {
		struct rnndelem *res = calloc(sizeof *res, 1);
		res->type = (strcmp(node->name, "stripe")?RNN_ETYPE_ARRAY:RNN_ETYPE_STRIPE);
		res->length = 1;
		res->file = file;
		xmlAttr *attr = node->properties;
		while (attr) {
			if (!strcmp(attr->name, "name")) {
				res->name = strdup(getattrib(db, file, node->line, attr));
			} else if (!strcmp(attr->name, "offset")) {
				res->offset = getnumattrib(db, file, node->line, attr);
			} else if (!strcmp(attr->name, "length")) {
				res->length = getnumattrib(db, file, node->line, attr);
			} else if (!strcmp(attr->name, "stride")) {
				res->stride = getnumattrib(db, file, node->line, attr);
			} else if (!strcmp(attr->name, "prefix")) {
				res->varinfo.prefixstr = strdup(getattrib(db, file, node->line, attr));
			} else if (!strcmp(attr->name, "varset")) {
				res->varinfo.varsetstr = strdup(getattrib(db, file, node->line, attr));
			} else if (!strcmp(attr->name, "variants")) {
				res->varinfo.variantsstr = strdup(getattrib(db, file, node->line, attr));
			} else {
				fprintf (stderr, "%s:%d: wrong attribute \"%s\" for %s\n", file, node->line, attr->name, node->name);
				db->estatus = 1;
			}
			attr = attr->next;
		}
		xmlNode *chain = node->children;
		while (chain) {
			struct rnndelem *delem;
			if (chain->type != XML_ELEMENT_NODE) {
			} else if ((delem = trydelem(db, file, chain))) {
				ADDARRAY(res->subelems, delem);
			} else if (!trytop(db, file, chain) && !trydoc(db, file, chain)) {
				fprintf (stderr, "%s:%d: wrong tag in %s: <%s>\n", file, chain->line, node->name, chain->name);
				db->estatus = 1;
			}
			chain = chain->next;
		}

		/* Sanity checking */
		if (res->type == RNN_ETYPE_ARRAY && res->stride == 0) {
			fprintf(stderr, "%s: Array %s's stride is undefined. Aborting.\n", file, res->name);
			exit(-1);
		}
		return res;

	}
	int width;
	if (!strcmp(node->name, "reg8"))
		width = 8;
	else if (!strcmp(node->name, "reg16"))
		width = 16;
	else if (!strcmp(node->name, "reg32"))
		width = 32;
	else if (!strcmp(node->name, "reg64"))
		width = 64;
	else
		return 0;
	struct rnndelem *res = calloc(sizeof *res, 1);
	res->file = file;
	res->type = RNN_ETYPE_REG;
	res->width = width;
	res->length = 1;
	res->access = RNN_ACCESS_RW;
	xmlAttr *attr = node->properties;
	while (attr) {
		if (!strcmp(attr->name, "name")) {
			res->name = strdup(getattrib(db, file, node->line, attr));
		} else if (!strcmp(attr->name, "offset")) {
			res->offset = getnumattrib(db, file, node->line, attr);
		} else if (!strcmp(attr->name, "length")) {
			res->length = getnumattrib(db, file, node->line, attr);
		} else if (!strcmp(attr->name, "stride")) {
			res->stride = getnumattrib(db, file, node->line, attr);
		} else if (!strcmp(attr->name, "varset")) {
			res->varinfo.varsetstr = strdup(getattrib(db, file, node->line, attr));
		} else if (!strcmp(attr->name, "variants")) {
			res->varinfo.variantsstr = strdup(getattrib(db, file, node->line, attr));
		} else if (!strcmp(attr->name, "access")) {
			char *str = getattrib(db, file, node->line, attr);
			if (!strcmp(str, "r"))
				res->access = RNN_ACCESS_R;
			else if (!strcmp(str, "w"))
				res->access = RNN_ACCESS_W;
			else if (!strcmp(str, "rw"))
				res->access = RNN_ACCESS_RW;
			else
				fprintf (stderr, "%s:%d: wrong access type \"%s\" for register\n", file, node->line, str);
		} else if (!trytypeattr(db, file, node, attr, &res->typeinfo)) {
			fprintf (stderr, "%s:%d: wrong attribute \"%s\" for register\n", file, node->line, attr->name);
			db->estatus = 1;
		}
		attr = attr->next;
	}
	xmlNode *chain = node->children;
	while (chain) {
		if (chain->type != XML_ELEMENT_NODE) {
		} else if (!trytypetag(db, file, chain, &res->typeinfo) && !trytop(db, file, chain) && !trydoc(db, file, chain)) {
			fprintf (stderr, "%s:%d: wrong tag in %s: <%s>\n", file, chain->line, node->name, chain->name);
			db->estatus = 1;
		}
		chain = chain->next;
	}
	if (!res->name) {
		fprintf (stderr, "%s:%d: nameless register\n", file, node->line);
		db->estatus = 1;
		return 0;
	} else {
	}
	return res;
}